

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

int QTest::qExec(QObject *testObject,QStringList *arguments)

{
  qsizetype qVar1;
  Data *pDVar2;
  int iVar3;
  iterator iVar4;
  ulong extraout_RAX;
  char *pcVar5;
  long lVar6;
  uint argc;
  ulong uVar7;
  long in_FS_OFFSET;
  QVarLengthArray<char_*,_256LL> argv;
  QArrayData *local_898;
  char *local_890;
  QByteArray local_880;
  QArrayDataPointer<QByteArray> local_868;
  long local_850;
  long local_848;
  char **local_840;
  char *local_838 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (arguments->d).size;
  memset(&local_850,0xaa,0x818);
  argc = (uint)qVar1;
  lVar6 = (long)(int)argc;
  local_850 = 0x100;
  local_848 = 0;
  local_840 = local_838;
  if (0x100 < lVar6) {
    qExec();
    if ((extraout_RAX & 1) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_001307ab;
    }
  }
  local_868.d = (Data *)0x0;
  local_868.ptr = (QByteArray *)0x0;
  local_868.size = 0;
  local_848 = lVar6;
  QList<QByteArray>::reserve((QList<QByteArray> *)&local_868,lVar6);
  if (0 < (int)argc) {
    lVar6 = 2;
    uVar7 = 0;
    do {
      QString::toLocal8Bit_helper
                ((QChar *)&local_898,*(longlong *)((long)(arguments->d).ptr + lVar6 * 8 + -8));
      pcVar5 = local_890;
      if (local_890 == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      QByteArray::QByteArray(&local_880,pcVar5,-1);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)&local_868,local_868.size,&local_880);
      QList<QByteArray>::end((QList<QByteArray> *)&local_868);
      if (&(local_880.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_880.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_880.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_898 != (QArrayData *)0x0) {
        LOCK();
        (local_898->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_898->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_898->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_898,1,0x10);
        }
      }
      iVar4 = QList<QByteArray>::end((QList<QByteArray> *)&local_868);
      pDVar2 = iVar4.i[-1].d.d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)(iVar4.i + -1),(AllocationOption)iVar4.i[-1].d.size);
      }
      local_840[uVar7] = iVar4.i[-1].d.ptr;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 3;
    } while ((argc & 0x7fffffff) != uVar7);
  }
  qInit(testObject,argc,local_840);
  iVar3 = qRun();
  qCleanup();
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_868);
  if (local_840 != local_838) {
    QtPrivate::sizedFree(local_840,local_850 << 3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
LAB_001307ab:
  __stack_chk_fail();
}

Assistant:

int QTest::qExec(QObject *testObject, const QStringList &arguments)
{
    const int argc = arguments.size();
    QVarLengthArray<char *> argv(argc);

    QList<QByteArray> args;
    args.reserve(argc);

    for (int i = 0; i < argc; ++i)
    {
        args.append(arguments.at(i).toLocal8Bit().constData());
        argv[i] = args.last().data();
    }

    return qExec(testObject, argc, argv.data());
}